

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void algorithm_suite::transform_empty(void)

{
  size_type *this;
  undefined4 local_7c;
  size_type local_78 [2];
  basic_moment<double,_(trial::online::with)1> *local_68;
  basic_moment<double,_(trial::online::with)1> *local_50;
  double *local_48;
  double *local_40;
  undefined1 local_38 [8];
  moment<double> filter;
  vector<double,_std::allocator<double>_> input;
  
  filter.member.count = 0;
  this = &filter.member.count;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::basic_moment
            ((basic_moment<double,_(trial::online::with)1> *)local_38);
  local_40 = (double *)
             std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)this);
  local_48 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)this);
  local_50 = (basic_moment<double,_(trial::online::with)1> *)
             trial::online::
             push_inserter<trial::online::cumulative::basic_moment<double,(trial::online::with)1>>
                       ((basic_moment<double,_(trial::online::with)1> *)local_38);
  local_68 = (basic_moment<double,_(trial::online::with)1> *)
             std::
             transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,trial::online::push_iterator<trial::online::cumulative::basic_moment<double,(trial::online::with)1>>,algorithm_suite::squared<double>>
                       (local_40,local_48,local_50);
  local_78[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::size
                          ((basic_moment<double,_(trial::online::with)1> *)local_38);
  local_7c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x2f7,"void algorithm_suite::transform_empty()",local_78,&local_7c);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&filter.member.count);
  return;
}

Assistant:

void transform_empty()
{
    std::vector<double> input = {};
    cumulative::moment<double> filter;
    std::transform(input.begin(), input.end(), push_inserter(filter), squared<double>());
    TRIAL_TEST_EQ(filter.size(), 0);
}